

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O0

void __thiscall CPP::WriteInitialization::acceptAction(WriteInitialization *this,DomAction *node)

{
  QLatin1StringView latin1;
  bool bVar1;
  DomActionGroup **ppDVar2;
  QTextStream *pQVar3;
  DomActionGroup *in_RSI;
  Driver *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar4;
  QString varName;
  QString actionName;
  uint in_stack_000003b4;
  DomPropertyList *in_stack_000003b8;
  QString *in_stack_000003c0;
  QString *in_stack_000003c8;
  WriteInitialization *in_stack_000003d0;
  DomAction *in_stack_ffffffffffffff48;
  QString *this_00;
  Driver *this_01;
  DomWidget *in_stack_ffffffffffffff80;
  Driver *in_stack_ffffffffffffff88;
  QString local_38;
  QString local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  bVar1 = DomAction::hasAttributeMenu((DomAction *)in_RSI);
  if (!bVar1) {
    local_20.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_20.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    local_20.d.size = -0x5555555555555556;
    Driver::findOrInsertAction(this_01,(DomAction *)in_RSI);
    local_38.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_38.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    local_38.d.size = -0x5555555555555556;
    this_00 = (QString *)(in_RDI->m_option).inputFile.d.d;
    QStack<DomWidget_*>::top((QStack<DomWidget_*> *)0x1379e1);
    Driver::findOrInsertWidget(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    ppDVar2 = QStack<DomActionGroup_*>::top((QStack<DomActionGroup_*> *)0x137a07);
    if (*ppDVar2 != (DomActionGroup *)0x0) {
      in_stack_ffffffffffffff48 = (DomAction *)(in_RDI->m_option).inputFile.d.d;
      QStack<DomActionGroup_*>::top((QStack<DomActionGroup_*> *)0x137a26);
      Driver::findOrInsertActionGroup(this_01,in_RSI);
      QString::operator=(this_00,&in_stack_ffffffffffffff48->m_attr_name);
      QString::~QString((QString *)0x137a53);
    }
    pQVar3 = (QTextStream *)
             QTextStream::operator<<
                       ((QTextStream *)(in_RDI->m_option).inputFile.d.ptr,
                        &(in_RDI->m_option).outputFile);
    pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,&local_20);
    pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3," = ");
    pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,(QString *)language::operatorNew);
    pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,"QAction(");
    pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,&local_38);
    pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,')');
    QTextStream::operator<<(pQVar3,(QString *)language::eol);
    QVar4 = Qt::Literals::StringLiterals::operator____L1((char *)in_RDI,(size_t)this_00);
    latin1.m_data = (char *)in_stack_ffffffffffffff88;
    latin1.m_size = (qsizetype)in_stack_ffffffffffffff80;
    QString::QString((QString *)QVar4.m_size,latin1);
    DomAction::elementProperty(in_stack_ffffffffffffff48);
    writeProperties(in_stack_000003d0,in_stack_000003c8,in_stack_000003c0,in_stack_000003b8,
                    in_stack_000003b4);
    QList<DomProperty_*>::~QList((QList<DomProperty_*> *)0x137b35);
    QString::~QString((QString *)0x137b3f);
    QString::~QString((QString *)0x137b4c);
    QString::~QString((QString *)0x137b59);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void WriteInitialization::acceptAction(DomAction *node)
{
    if (node->hasAttributeMenu())
        return;

    const QString actionName = m_driver->findOrInsertAction(node);
    QString varName = m_driver->findOrInsertWidget(m_widgetChain.top());

    if (m_actionGroupChain.top())
        varName = m_driver->findOrInsertActionGroup(m_actionGroupChain.top());

    m_output << m_indent << actionName << " = " << language::operatorNew
        << "QAction(" << varName << ')' << language::eol;
    writeProperties(actionName, "QAction"_L1, node->elementProperty());
}